

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::createVertexArrayObject
          (CaptureVertexInterleaved *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x708))(1,&this->m_vertex_array_object);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa2f);
  (**(code **)(lVar3 + 0xd8))(this->m_vertex_array_object);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa32);
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexInterleaved::createVertexArrayObject(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO Creations */
	gl.genVertexArrays(1, &m_vertex_array_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vertex_array_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");
}